

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O2

int f(int h,int m,uint *I2_start,uint *I2_end)

{
  int iVar1;
  int iVar2;
  
  iVar1 = first_geq(I2_start,m,h);
  iVar2 = 0;
  if (((iVar1 != 0) && (I2_start[iVar1 - 1U] <= h - 1U)) &&
     (iVar2 = 0, h + 1U <= I2_end[iVar1 - 1U])) {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int f(int h, int m, unsigned int* I2_start, unsigned int* I2_end)
{
    int i;
    i = first_geq(I2_start, m, h);
    if (i<1)
        return 0;
    int z = ceil(double(I2_end[i-1]-I2_start[i-1])/2);
    z = 1;
    if (I2_start[i-1]<=h-z && I2_end[i-1]>=h+z)
        return 1;
    return 0;
}